

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::Stage::GetPrimFromRelativePath_abi_cxx11_
          (expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Stage *this,Prim *root,Path *path)

{
  bool bVar1;
  unexpected_type<const_char_*> local_48;
  unexpected_type<const_char_*> local_40;
  unexpected_type<const_char_*> local_38;
  unexpected_type<const_char_*> local_30;
  Path *local_28;
  Path *path_local;
  Prim *root_local;
  Stage *this_local;
  
  local_28 = path;
  path_local = &root->_abs_path;
  root_local = (Prim *)this;
  this_local = (Stage *)__return_storage_ptr__;
  bVar1 = Path::is_valid(path);
  if (bVar1) {
    bVar1 = Path::is_absolute_path(local_28);
    if (bVar1) {
      local_38 = nonstd::expected_lite::make_unexpected<char_const(&)[42]>
                           ((char (*) [42])"Path is absolute. Path must be relative.\n");
      nonstd::expected_lite::
      expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<const_char_*,_0>(__return_storage_ptr__,&local_38);
    }
    else {
      bVar1 = Path::is_relative_path(local_28);
      if (bVar1) {
        local_48 = nonstd::expected_lite::make_unexpected<char_const(&)[32]>
                             ((char (*) [32])"GetPrimFromRelativePath is TODO");
        nonstd::expected_lite::
        expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>(__return_storage_ptr__,&local_48);
      }
      else {
        local_40 = nonstd::expected_lite::make_unexpected<char_const(&)[15]>
                             ((char (*) [15])"Invalid Path.\n");
        nonstd::expected_lite::
        expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>(__return_storage_ptr__,&local_40);
      }
    }
  }
  else {
    local_30 = nonstd::expected_lite::make_unexpected<char_const(&)[18]>
                         ((char (*) [18])"Path is invalid.\n");
    nonstd::expected_lite::
    expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<const Prim *, std::string> Stage::GetPrimFromRelativePath(
    const Prim &root, const Path &path) const {
  // TODO: Resolve "../"
  // TODO: cache path

  if (!path.is_valid()) {
    return nonstd::make_unexpected("Path is invalid.\n");
  }

  if (path.is_absolute_path()) {
    return nonstd::make_unexpected(
        "Path is absolute. Path must be relative.\n");
  }

  if (path.is_relative_path()) {
    // ok
  } else {
    return nonstd::make_unexpected("Invalid Path.\n");
  }

#if 0  // TODO
  Path abs_path = root.element_path();
  abs_path.AppendElement(path.GetPrimPart());

  DCOUT("root path = " << root.path());
  DCOUT("abs path = " << abs_path);

  // Brute-force search from Stage root.
  if (auto pv = GetPrimAtPathRec(&root, /* root */"", abs_path, /* depth */0)) {
    return pv.value();
  }

  return nonstd::make_unexpected("Cannot find path <" + path.full_path_name() +
                                 "> under Prim: " + to_string(root.path) +
                                 "\n");
#else
  (void)root;
  return nonstd::make_unexpected("GetPrimFromRelativePath is TODO");
#endif
}